

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O3

ostream * Gudhi::skeleton_blocker::operator<<
                    (ostream *o,
                    Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *sigma)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"{",1);
  p_Var3 = (sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    bVar2 = true;
    do {
      _Var1 = p_Var3[1]._M_color;
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(o,",",1);
      }
      std::ostream::operator<<((ostream *)o,_Var1);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar2 = false;
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"}",1);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                                  const Skeleton_blocker_simplex & sigma) {
    bool first = true;
    o << "{";
    for (auto i : sigma) {
      if (first)
        first = false;
      else
        o << ",";
      o << i;
    }
    o << "}";
    return o;
  }